

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O3

int base58_decode(char *base58,size_t base58_len,uchar *bytes_out,size_t *len)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  undefined1 *dest;
  ulong uVar4;
  long lVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  size_t __n;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint32_t bn_buf [128];
  undefined1 local_238 [520];
  
  if (base58_len == 0 || base58 == (char *)0x0) {
    return -2;
  }
  uVar13 = base58_len * 6 + 7;
  __n = 0;
  do {
    if (base58[__n] != '1') {
      lVar11 = base58_len - __n;
      if (lVar11 != 0) {
        uVar8 = lVar11 * 6 + 7;
        uVar4 = (uVar8 >> 3) + 3;
        if (uVar8 < 0x1008) {
          dest = local_238;
        }
        else {
          dest = (undefined1 *)wally_malloc(uVar4 & 0x3ffffffffffffffc);
          if (dest == (undefined1 *)0x0) {
            return -3;
          }
        }
        puVar1 = (uint *)(dest + (uVar4 & 0xfffffffffffffffc));
        puVar1[-1] = 0;
        uVar13 = (uVar13 >> 3) + 3 & 0xfffffffffffffffc;
        lVar10 = -4;
        lVar5 = 0;
        goto LAB_00496c16;
      }
      break;
    }
    __n = __n + 1;
    uVar13 = uVar13 - 6;
  } while (__n != base58_len);
  if ((bytes_out != (uchar *)0x0) && (base58_len <= *len)) {
    memset(bytes_out,0,base58_len);
  }
  *len = base58_len;
  return 0;
LAB_00496c16:
  do {
    if (""[(byte)base58[lVar5 + __n]] == '\0') {
      iVar12 = -2;
      goto LAB_00496cf4;
    }
    if (lVar10 < -3) {
      uVar8 = (ulong)(byte)(""[(byte)base58[lVar5 + __n]] - 1);
      lVar9 = -4;
      do {
        uVar7 = uVar8 + (ulong)*(uint *)(dest + lVar9 + uVar13) * 0x3a;
        *(int *)(dest + lVar9 + uVar13) = (int)uVar7;
        uVar8 = uVar7 >> 0x20;
        if ((lVar10 == lVar9) && (uVar8 != 0)) {
          *(int *)((long)puVar1 + lVar10 + -4) = (int)(uVar7 >> 0x20);
          lVar10 = lVar10 + -4;
          break;
        }
        lVar3 = lVar9 + uVar13;
        lVar9 = lVar9 + -4;
      } while ((undefined1 *)((long)puVar1 + lVar10) <= dest + lVar3 + -4);
    }
    lVar5 = lVar5 + 1;
  } while (lVar11 != lVar5);
  if (lVar10 < 0) {
    puVar6 = (uint *)((long)puVar1 + lVar10);
    do {
      uVar2 = *puVar6;
      *puVar6 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      puVar6 = puVar6 + 1;
    } while (puVar6 < puVar1);
  }
  lVar10 = lVar10 + -1;
  do {
    lVar11 = lVar10 + uVar13 + 1;
    lVar10 = lVar10 + 1;
  } while (dest[lVar11] == '\0');
  if ((bytes_out != (uchar *)0x0) && (__n - lVar10 <= *len)) {
    memset(bytes_out,0,__n);
    memcpy(bytes_out + __n,dest + uVar13 + lVar10,-lVar10);
  }
  *len = __n - lVar10;
  iVar12 = 0;
LAB_00496cf4:
  wally_clear(dest,uVar4 & 0x3ffffffffffffffc);
  if (dest != local_238) {
    wally_free(dest);
  }
  return iVar12;
}

Assistant:

static int base58_decode(const char *base58, size_t base58_len,
                         unsigned char *bytes_out, size_t *len)
{
    uint32_t bn_buf[BIGNUM_WORDS];
    uint32_t *bn = bn_buf, *top_word, *bn_p;
    size_t bn_words = 0, ones, cp_len, i;
    unsigned char *cp;
    int ret = WALLY_EINVAL;

    if (!base58 || !base58_len)
        return WALLY_EINVAL; /* Empty string can't be decoded or represented */

    /* Process leading '1's */
    for (ones = 0; ones < base58_len && base58[ones] == '1'; ++ones)
        ; /* no-op*/

    if (!(base58_len -= ones)) {
        if (bytes_out && ones <= *len)
            memset(bytes_out, 0, ones);
        *len = ones;
        return WALLY_OK; /* String of all '1's */
    }
    base58 += ones; /* Skip over leading '1's */

    /* Take 6 bits to store each 58 bit number, rounded up to the next byte,
     * then round that up to a uint32_t word boundary. */
    bn_words = ((base58_len * 6 + 7) / 8 + 3) / 4;

    /* Allocate our bignum buffer if it won't fit on the stack */
    if (bn_words > BIGNUM_WORDS)
        if (!(bn = wally_malloc(bn_words * sizeof(*bn)))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

    /* Iterate through the characters adding them to our bignum. We keep
     * track of the current top word to avoid iterating over words that
     * we know are zero. */
    top_word = bn + bn_words - 1;
    *top_word = 0;

    for (i = 0; i < base58_len; ++i) {
        unsigned char byte = base58_to_byte[((unsigned char *)base58)[i]];
        if (!byte--)
            goto cleanup; /* Invalid char */

        for (bn_p = bn + bn_words - 1; bn_p >= top_word; --bn_p) {
            uint64_t mult = *bn_p * 58ull + byte;
            *bn_p = mult & 0xffffffff;
            byte = (mult >> 32) & 0xff;
            if (byte && bn_p == top_word) {
                *--top_word = byte; /* Increase bignum size */
                break;
            }
        }
    }

    /* We have our bignum stored from top_word to bn + bn_words - 1. Convert
     * its words to big-endian so we can simply memcpy it to bytes_out. */
    for (bn_p = top_word; bn_p < bn + bn_words; ++bn_p)
        *bn_p = cpu_to_be32(*bn_p); /* No-op on big-endian machines */

    for (cp = (unsigned char *)top_word; !*cp; ++cp)
        ; /* Skip leading zero bytes in our bignum */

    /* Copy the result if it fits, cleanup and return */
    cp_len = (unsigned char *)(bn + bn_words) - cp;

    if (bytes_out && ones + cp_len <= *len) {
        memset(bytes_out, 0, ones);
        memcpy(bytes_out + ones, cp, cp_len);
    }

    *len = ones + cp_len;
    ret = WALLY_OK;

cleanup:
    if (bn) {
        wally_clear(bn, bn_words * sizeof(*bn));
        if (bn != bn_buf)
            wally_free(bn);
    }
    return ret;
}